

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

void ggml_opt_free(ggml_opt_context_t opt_ctx)

{
  void *in_RDI;
  ggml_backend_buffer_t in_stack_fffffffffffffff0;
  
  if (in_RDI != (void *)0x0) {
    ggml_backend_buffer_free(in_stack_fffffffffffffff0);
    ggml_backend_buffer_free(in_stack_fffffffffffffff0);
    ggml_free((ggml_context *)0x16644d);
    ggml_free((ggml_context *)0x16645b);
    if (in_RDI != (void *)0x0) {
      operator_delete(in_RDI,0x1448);
    }
  }
  return;
}

Assistant:

void ggml_opt_free(ggml_opt_context_t opt_ctx) {
    if (opt_ctx == nullptr) {
        return;
    }
    ggml_backend_buffer_free(opt_ctx->buf_static);
    ggml_backend_buffer_free(opt_ctx->buf_static_cpu);
    ggml_free(opt_ctx->ctx_static);
    ggml_free(opt_ctx->ctx_static_cpu);
    delete opt_ctx;
}